

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SW2048Game.cpp
# Opt level: O0

void __thiscall SW2048Game::SW2048Game(SW2048Game *this,int order)

{
  ProcessingQueue *this_00;
  int order_local;
  SW2048Game *this_local;
  
  this->MAX = 0x4000;
  this_00 = (ProcessingQueue *)operator_new(0x18);
  ProcessingQueue::ProcessingQueue(this_00,order);
  this->processQueue = this_00;
  this->order = order;
  std::vector<int_*,_std::allocator<int_*>_>::vector(&this->blankList);
  this->playing = false;
  allocBoard(this);
  return;
}

Assistant:

SW2048Game::SW2048Game(int order) : order(order), processQueue(new ProcessingQueue(order))
{
	playing = false;
	allocBoard();
}